

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

bool __thiscall
xatlas::internal::BitImage::canBlit
          (BitImage *this,BitImage *image,uint32_t offsetX,uint32_t offsetY)

{
  uint uVar1;
  unsigned_long *puVar2;
  uint64_t block;
  ulong uStack_48;
  uint32_t blockShift;
  uint64_t thisBlock;
  uint local_38;
  uint32_t thisBlockShift;
  uint32_t thisX;
  uint32_t x;
  uint32_t thisY;
  uint32_t y;
  uint32_t offsetY_local;
  uint32_t offsetX_local;
  BitImage *image_local;
  BitImage *this_local;
  
  x = 0;
  thisY = offsetY;
  y = offsetX;
  _offsetY_local = image;
  image_local = this;
  do {
    if (_offsetY_local->m_height <= x) {
      return true;
    }
    thisX = x + thisY;
    if (thisX < this->m_height) {
      thisBlockShift = 0;
      do {
        local_38 = thisBlockShift + y;
        if (this->m_width <= local_38) break;
        thisBlock._4_4_ = local_38 & 0x3f;
        puVar2 = Array<unsigned_long>::operator[]
                           (&this->m_data,(local_38 >> 6) + thisX * this->m_rowStride);
        uStack_48 = *puVar2 >> ((byte)thisBlock._4_4_ & 0x3f);
        block._4_4_ = thisBlockShift & 0x3f;
        puVar2 = Array<unsigned_long>::operator[]
                           (&_offsetY_local->m_data,
                            (thisBlockShift >> 6) + x * _offsetY_local->m_rowStride);
        if ((uStack_48 & *puVar2 >> ((byte)block._4_4_ & 0x3f)) != 0) {
          return false;
        }
        uVar1 = max<unsigned_int>((uint *)((long)&thisBlock + 4),(uint *)((long)&block + 4));
        thisBlockShift = (0x40 - uVar1) + thisBlockShift;
      } while (thisBlockShift < _offsetY_local->m_width);
    }
    x = x + 1;
  } while( true );
}

Assistant:

bool canBlit(const BitImage &image, uint32_t offsetX, uint32_t offsetY) const
	{
		for (uint32_t y = 0; y < image.m_height; y++) {
			const uint32_t thisY = y + offsetY;
			if (thisY >= m_height)
				continue;
			uint32_t x = 0;
			for (;;) {
				const uint32_t thisX = x + offsetX;
				if (thisX >= m_width)
					break;
				const uint32_t thisBlockShift = thisX % 64;
				const uint64_t thisBlock = m_data[(thisX >> 6) + thisY * m_rowStride] >> thisBlockShift;
				const uint32_t blockShift = x % 64;
				const uint64_t block = image.m_data[(x >> 6) + y * image.m_rowStride] >> blockShift;
				if ((thisBlock & block) != 0)
					return false;
				x += 64 - max(thisBlockShift, blockShift);
				if (x >= image.m_width)
					break;
			}
		}
		return true;
	}